

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

void out_logfile_print(char *txt,int nl)

{
  if (logfp != (osfildef *)0x0) {
    os_fprintz(logfp,txt);
    if (nl != 0) {
      os_fprintz(logfp,"\n");
      if ((G_log_disp.html_target != 0) && (G_log_disp.html_mode != 0)) {
        os_fprintz(logfp,"<BR HEIGHT=0>\n");
      }
    }
    fflush((FILE *)logfp);
    return;
  }
  return;
}

Assistant:

void out_logfile_print(char *txt, int nl)
{
    /* if there's no log file, there's nothing to do */
    if (logfp == 0)
        return;

    /* add the text */
    os_fprintz(logfp, txt);

    /* add a newline if desired */
    if (nl)
    {
        /* add a normal newline */
        os_fprintz(logfp, "\n");

        /* if the logfile is an html target, write an HTML line break */
        if (G_log_disp.html_target && G_log_disp.html_mode)
            os_fprintz(logfp, "<BR HEIGHT=0>\n");
    }

    /* flush the output */
    osfflush(logfp);
}